

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O1

void dsc_xor_group(Dsc_node_t *pOut,Dsc_node_t *ni,Dsc_node_t *nj,int nVars,int TRUTH_WORDS)

{
  uint *cubeCof;
  uint *cubeCof_00;
  uint *cubeCof_01;
  uint *cubeCof_02;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  word *pwVar5;
  uint uVar6;
  char *pcVar7;
  Dsc_node_t *pDVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  uint *cubeCof_03;
  
  uVar1 = ni->on[0];
  uVar6 = ni->off[0];
  uVar2 = nj->on[0];
  uVar3 = nj->off[0];
  pcVar7 = pOut->exp + 1;
  pOut->exp[0] = '[';
  cVar9 = ni->exp[0];
  if (cVar9 != '\0') {
    pcVar12 = ni->exp;
    do {
      pcVar12 = pcVar12 + 1;
      *pcVar7 = cVar9;
      pcVar7 = pcVar7 + 1;
      cVar9 = *pcVar12;
    } while (cVar9 != '\0');
  }
  cVar9 = nj->exp[0];
  if (cVar9 != '\0') {
    pcVar12 = nj->exp;
    do {
      pcVar12 = pcVar12 + 1;
      *pcVar7 = cVar9;
      pcVar7 = pcVar7 + 1;
      cVar9 = *pcVar12;
    } while (cVar9 != '\0');
  }
  cubeCof = ni->off;
  cubeCof_00 = ni->on;
  cubeCof_01 = nj->off;
  cubeCof_02 = nj->on;
  uVar10 = uVar1;
  if ((int)uVar6 < (int)uVar1) {
    uVar10 = uVar6;
  }
  uVar11 = uVar10;
  if ((int)uVar3 <= (int)uVar10) {
    uVar11 = uVar3;
  }
  pcVar7[0] = ']';
  pcVar7[1] = '\0';
  pDVar8 = nj;
  if ((int)uVar10 <= (int)uVar3) {
    pDVar8 = ni;
  }
  if ((int)uVar2 < (int)uVar11) {
    pDVar8 = nj;
  }
  if (pDVar8 == ni) {
    if ((int)uVar11 <= (int)uVar2 && ((int)uVar3 < (int)uVar10 || (int)uVar6 <= (int)uVar1)) {
      pwVar5 = nj->pNegCof;
      pOut->pNegCof = pwVar5;
      cubeCofactor(pwVar5,cubeCof,TRUTH_WORDS);
      pDVar8 = (Dsc_node_t *)&nj->pPosCof;
      cubeCof_03 = cubeCof;
    }
    else {
      pwVar5 = nj->pPosCof;
      pOut->pNegCof = pwVar5;
      cubeCofactor(pwVar5,cubeCof_00,TRUTH_WORDS);
      pDVar8 = nj;
      cubeCof_03 = cubeCof_00;
    }
  }
  else if ((int)uVar11 <= (int)uVar2 && ((int)uVar3 < (int)uVar10 || (int)uVar6 <= (int)uVar1)) {
    pwVar5 = ni->pNegCof;
    pOut->pNegCof = pwVar5;
    cubeCofactor(pwVar5,cubeCof_01,TRUTH_WORDS);
    pDVar8 = (Dsc_node_t *)&ni->pPosCof;
    cubeCof_03 = cubeCof_01;
  }
  else {
    pwVar5 = ni->pPosCof;
    pOut->pNegCof = pwVar5;
    cubeCofactor(pwVar5,cubeCof_02,TRUTH_WORDS);
    pDVar8 = ni;
    cubeCof_03 = cubeCof_02;
  }
  pwVar5 = pDVar8->pNegCof;
  pOut->pPosCof = pwVar5;
  cubeCofactor(pwVar5,cubeCof_03,TRUTH_WORDS);
  pOut->pBoolDiff = ni->pBoolDiff;
  pOut->off[0] = 0;
  if ((int)(uVar2 + uVar1) < (int)(uVar3 + uVar6)) {
    uVar10 = *cubeCof_00;
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        pOut->off[uVar13 + 1] = ni->on[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    uVar4 = pOut->off[0];
    pOut->off[0] = uVar4 + uVar10;
    uVar11 = *cubeCof_02;
    if (0 < (int)uVar11) {
      uVar13 = 0;
      do {
        pOut->off[(int)(uVar10 + uVar4 + 1 + (int)uVar13)] = nj->on[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  else {
    uVar10 = *cubeCof;
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        pOut->off[uVar13 + 1] = ni->off[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    uVar4 = pOut->off[0];
    pOut->off[0] = uVar4 + uVar10;
    uVar11 = *cubeCof_01;
    if (0 < (int)uVar11) {
      uVar13 = 0;
      do {
        pOut->off[(int)(uVar10 + uVar4 + 1 + (int)uVar13)] = nj->off[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  pOut->off[0] = pOut->off[0] + uVar11;
  pOut->on[0] = 0;
  if ((int)(uVar3 + uVar1) < (int)(uVar2 + uVar6)) {
    uVar1 = *cubeCof_00;
    if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        pOut->on[uVar13 + 1] = ni->on[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
    }
    uVar2 = pOut->on[0];
    pOut->on[0] = uVar2 + uVar1;
    uVar6 = *cubeCof_01;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        pOut->on[(int)(uVar1 + uVar2 + 1 + (int)uVar13)] = nj->off[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
  }
  else {
    uVar1 = *cubeCof;
    if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        pOut->on[uVar13 + 1] = ni->off[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
    }
    uVar2 = pOut->on[0];
    pOut->on[0] = uVar2 + uVar1;
    uVar6 = *cubeCof_02;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        pOut->on[(int)(uVar1 + uVar2 + 1 + (int)uVar13)] = nj->on[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
  }
  pOut->on[0] = pOut->on[0] + uVar6;
  return;
}

Assistant:

void dsc_xor_group(Dsc_node_t * pOut, Dsc_node_t * ni, Dsc_node_t * nj, int nVars, const int TRUTH_WORDS) {
    //
    const unsigned int * xiOFF = ni->off;
    const unsigned int * xiON = ni->on;
    const unsigned int * xjOFF = nj->off;
    const unsigned int * xjON = nj->on;
    //
    const int xiOFFSize = xiOFF[0];
    const int xiONSize = xiON[0];
    const int xjOFFSize = xjOFF[0];
    const int xjONSize = xjON[0];
    // minCubeCofs
    int minCCSize = xiOFFSize;
    int minCCPolarity = 0;
    Dsc_node_t * minCCNode = ni;
    // expression
    concat(pOut->exp, '[', ']', ni->exp, 1, nj->exp, 1);
    if (minCCSize > xiONSize) {
        minCCSize = xiONSize;
        minCCPolarity = 1;
        //minCCNode = ni;
    }
    if (minCCSize > xjOFFSize) {
        minCCSize = xjOFFSize;
        minCCPolarity = 0;
        minCCNode = nj;
    }
    if (minCCSize > xjONSize) {
        minCCSize = xjONSize;
        minCCPolarity = 1;
        minCCNode = nj;
    }
    //
    if (minCCNode == ni) {
        if (minCCPolarity) {
            // gOFF = xiON, xjON
            pOut->pNegCof = nj->pPosCof;
            cubeCofactor(pOut->pNegCof, xiON, TRUTH_WORDS);
            // gON = xiON, xjOFF
            pOut->pPosCof = nj->pNegCof;
            cubeCofactor(pOut->pPosCof, xiON, TRUTH_WORDS);
        } else {
            // gOFF = xiOFF, xjOFF
            pOut->pNegCof = nj->pNegCof;
            cubeCofactor(pOut->pNegCof, xiOFF, TRUTH_WORDS);
            // gON = xiOFF, xjON
            pOut->pPosCof = nj->pPosCof;
            cubeCofactor(pOut->pPosCof, xiOFF, TRUTH_WORDS);
        }
    }else  {
        if (minCCPolarity) {
            // gOFF = xjON, xiON
            pOut->pNegCof = ni->pPosCof;
            cubeCofactor(pOut->pNegCof, xjON, TRUTH_WORDS);
            // gON = xjON, xiOFF
            pOut->pPosCof = ni->pNegCof;
            cubeCofactor(pOut->pPosCof, xjON, TRUTH_WORDS);
        } else {
            // gOFF = xjOFF, xiOFF
            pOut->pNegCof = ni->pNegCof;
            cubeCofactor(pOut->pNegCof, xjOFF, TRUTH_WORDS);
            // gON = xjOFF, xiON
            pOut->pPosCof = ni->pPosCof;
            cubeCofactor(pOut->pPosCof, xjOFF, TRUTH_WORDS);
        }
    }
    // bool diff
    pOut->pBoolDiff = ni->pBoolDiff;
    // evaluating specs
    // off spec
    pOut->off[0] = 0;
    if ((xiOFFSize+xjOFFSize) <= (xiONSize+xjONSize)) {
        merge(pOut->off, xiOFF);
        merge(pOut->off, xjOFF);
    } else {
        merge(pOut->off, xiON);
        merge(pOut->off, xjON);
    }
    // on spec
    pOut->on[0] = 0;
    if ((xiOFFSize+xjONSize) <= (xiONSize+xjOFFSize)) {
        merge(pOut->on, xiOFF);
        merge(pOut->on, xjON);
    } else {
        merge(pOut->on, xiON);
        merge(pOut->on, xjOFF);
    }
}